

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O1

size_t anurbs::HilbertCurve<3L>::d(size_t i)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (i != 0) {
    if ((i & 1) == 0) {
      uVar2 = i - 1;
    }
    else {
      uVar2 = i + 1;
    }
    uVar4 = (uVar2 ^ i) >> 1 ^ uVar2 ^ i;
    uVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    sVar3 = 0;
    if (1 < uVar4) {
      sVar3 = uVar2 + SUB168(auVar1 * ZEXT816(0x5555555555555556),8) * -3;
    }
    return sVar3;
  }
  return 0;
}

Assistant:

static size_t d(const size_t i) noexcept
    {
        if (i == 0) {
            return 0;
        } else if (i % 2 == 0) {
            return g(i - 1) % TDimension;
        } else {
            return g(i) % TDimension;
        }
    }